

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.h
# Opt level: O1

void wabt::cat_concatenate<std::__cxx11::string,char[2],std::__cxx11::string>
               (string *s,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t,
               char (*args) [2],
               basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  std::__cxx11::string::_M_append((char *)s,(ulong)(t->_M_dataplus)._M_p);
  std::__cxx11::string::append((char *)s);
  std::__cxx11::string::_M_append((char *)s,(ulong)(args_1->_M_dataplus)._M_p);
  return;
}

Assistant:

void cat_concatenate(std::string& s, const T& t, const Ts&... args) {
    s += t;
    cat_concatenate(s, args...);
}